

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int n;
  uint uVar1;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    printf("%s",(anonymous_namespace)::USAGE);
  }
  else {
    n = atoi(argv[1]);
    uVar1 = fib(n);
    printf("%d\n",(ulong)uVar1);
    printf("%d\n",1000000);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc < 2) {
    printf("%s", USAGE);
    return 0;
  }

  printf("%d\n", fib(atoi(argv[1])));
  printf("%d\n", DIGIT_SEPARATORS_TEST);
  return 0;
}